

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall Log::Add(Log *this,string *message)

{
  _func_void_string *p_Var1;
  string in_stack_ffffffffffffff48;
  string local_88 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  string *local_18;
  string *message_local;
  Log *this_local;
  
  local_18 = message;
  message_local = &this->_logText;
  std::operator+(local_58,(char *)this);
  std::operator+(local_38,local_58);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  if (this->_printFunction != (_func_void_string *)0x0) {
    p_Var1 = this->_printFunction;
    std::__cxx11::string::string(local_88,(string *)message);
    (*p_Var1)(in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_88);
  }
  return;
}

Assistant:

void Log::Add(string message) {
  _logText + "\n" + message;
  if (_printFunction != nullptr) {
    _printFunction(message);
  }
}